

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_etc.cpp
# Opt level: O1

bool __thiscall crnlib::etc1_optimizer::compute(etc1_optimizer *this)

{
  undefined4 uVar1;
  undefined8 uVar2;
  ulong uVar3;
  undefined4 uVar4;
  byte bVar5;
  uint uVar6;
  int iVar7;
  params *ppVar8;
  uchar *__src;
  results *prVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [14];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [16];
  undefined1 auVar19 [15];
  unkuint9 Var20;
  undefined1 auVar21 [11];
  undefined1 auVar22 [13];
  undefined1 auVar23 [14];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  int iVar26;
  bool bVar27;
  uint uVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  int xdi;
  byte bVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ushort uVar44;
  float fVar45;
  int iVar51;
  int iVar53;
  int iVar54;
  undefined1 auVar47 [16];
  int iVar56;
  undefined1 auVar48 [16];
  float fVar46;
  float fVar52;
  float fVar55;
  float fVar57;
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  etc1_solution_coordinates coords1;
  etc1_solution_coordinates coords;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_b8;
  undefined4 local_b4;
  undefined1 local_b0;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_ac;
  undefined4 local_a8;
  undefined1 local_a4;
  potential_solution *local_a0;
  potential_solution *local_98;
  int local_8c;
  uint local_88;
  int local_84;
  uint local_80;
  int local_7c;
  uint local_78;
  int local_74;
  long local_70;
  long local_68;
  long local_60;
  float local_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float local_48;
  undefined4 uStack_40;
  
  uVar6 = this->m_pParams->m_num_src_pixels;
  lVar31 = (long)(int)this->m_pParams->m_scan_delta_size;
  if (0 < lVar31) {
    local_98 = &this->m_trial_solution;
    local_a0 = &this->m_best_solution;
    local_58 = (float)uVar6;
    uStack_40 = 0;
    lVar30 = 0;
    local_60 = lVar31;
    fStack_54 = local_58;
    fStack_50 = local_58;
    fStack_4c = local_58;
    local_48 = local_58;
    do {
      local_8c = this->m_pParams->m_pScan_deltas[lVar30];
      uVar33 = this->m_bb + local_8c;
      local_70 = lVar30;
      if ((int)uVar33 < 0) {
        bVar27 = false;
      }
      else {
        bVar27 = this->m_limit < (int)uVar33;
        if ((int)uVar33 <= this->m_limit) {
          local_88 = 0xff;
          if ((int)uVar33 < 0xff) {
            local_88 = uVar33;
          }
          lVar30 = 0;
          local_80 = uVar33;
          do {
            iVar26 = local_8c;
            iVar7 = this->m_pParams->m_pScan_deltas[lVar30];
            iVar34 = this->m_bg + iVar7;
            local_68 = lVar30;
            if (iVar34 < 0) {
              iVar38 = 7;
            }
            else {
              iVar38 = 5;
              if (iVar34 <= this->m_limit) {
                local_84 = 0xff;
                if (iVar34 < 0xff) {
                  local_84 = iVar34;
                }
                lVar30 = 0;
                do {
                  ppVar8 = this->m_pParams;
                  iVar38 = ppVar8->m_pScan_deltas[lVar30];
                  uVar33 = this->m_br + iVar38;
                  if ((int)uVar33 < 0) {
                    iVar37 = 10;
                  }
                  else {
                    iVar37 = 8;
                    if ((int)uVar33 <= this->m_limit) {
                      local_a4 = ppVar8->m_use_color4;
                      uVar28 = 0xff;
                      if ((int)uVar33 < 0xff) {
                        uVar28 = uVar33;
                      }
                      local_ac.field_0.r = (uchar)uVar28;
                      local_ac.field_0.g = (uchar)local_84;
                      local_ac.field_0.b = (uchar)local_88;
                      local_ac.field_0.a = 0xff;
                      local_a8 = 0;
                      local_78 = uVar33;
                      if ((ppVar8->super_crn_etc1_pack_params).m_quality == cCRNETCQualitySlow) {
                        bVar27 = evaluate_solution(this,(etc1_solution_coordinates *)
                                                        &local_ac.field_0,local_98,local_a0);
                      }
                      else {
                        bVar27 = evaluate_solution_fast
                                           (this,(etc1_solution_coordinates *)&local_ac.field_0,
                                            local_98,local_a0);
                      }
                      lVar31 = local_60;
                      iVar37 = 10;
                      if (bVar27 != false) {
                        bVar27 = iVar38 == 0 && (iVar7 == 0 && iVar26 == 0);
                        local_7c = bVar27 + 2 + (uint)bVar27;
                        if ((this->m_pParams->super_crn_etc1_pack_params).m_quality ==
                            cCRNETCQualityFast) {
                          local_7c = 2;
                        }
                        iVar38 = 0;
                        while( true ) {
                          bVar32 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0
                                   .r;
                          uVar33 = (uint)bVar32;
                          if ((this->m_best_solution).m_coords.m_color4 == true) {
                            bVar32 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                     field_0.g;
                            auVar39._0_4_ = uVar33 << 4;
                            auVar39._4_4_ = (uint)bVar32 << 4;
                            auVar39._8_8_ = 0;
                            auVar39 = auVar39 | ZEXT516(CONCAT14(bVar32,uVar33));
                            uVar28 = (uint)(this->m_best_solution).m_coords.m_unscaled_color.field_0
                                           .field_0.b;
                            uVar33 = uVar28 << 4;
                          }
                          else {
                            bVar5 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                    field_0.g;
                            auVar59._0_4_ = uVar33 << 3;
                            auVar59._4_4_ = (uint)bVar5 << 3;
                            auVar59._8_8_ = 0;
                            auVar39 = auVar59 | ZEXT516(CONCAT14(bVar5 >> 2,(uint)(bVar32 >> 2)));
                            bVar32 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                     field_0.b;
                            uVar28 = (uint)(bVar32 >> 2);
                            uVar33 = (uint)bVar32 << 3;
                          }
                          uVar33 = uVar33 | uVar28;
                          if (uVar6 == 0) {
                            auVar47 = (undefined1  [16])0x0;
                            iVar29 = 0;
                          }
                          else {
                            if (0xfe < uVar33) {
                              uVar33 = 0xff;
                            }
                            auVar58._0_4_ = -(uint)(auVar39._0_4_ < (int)DAT_001baf10);
                            auVar58._4_4_ = -(uint)(auVar39._4_4_ < DAT_001baf10._4_4_);
                            auVar58._8_4_ = -(uint)(auVar39._8_4_ < DAT_001baf10._8_4_);
                            auVar58._12_4_ = -(uint)(auVar39._12_4_ < DAT_001baf10._12_4_);
                            auVar59 = ~auVar58 & _DAT_001baf10 | auVar39 & auVar58;
                            auVar47 = (undefined1  [16])0x0;
                            auVar40._0_4_ = -(uint)(0 < auVar59._0_4_);
                            auVar40._4_4_ = -(uint)(0 < auVar59._4_4_);
                            auVar40._8_4_ = -(uint)(0 < auVar59._8_4_);
                            auVar40._12_4_ = -(uint)(0 < auVar59._12_4_);
                            auVar40 = auVar40 & auVar59;
                            lVar31 = 0;
                            iVar29 = 0;
                            do {
                              iVar36 = (&g_etc1_inten_tables)
                                       [(ulong)(this->m_best_solution).m_coords.m_inten_table * 4 +
                                        (ulong)(this->m_best_solution).m_selectors.m_p[lVar31]];
                              iVar37 = iVar36 + auVar40._0_4_;
                              if (0xfe < iVar37) {
                                iVar37 = 0xff;
                              }
                              if (iVar37 < 1) {
                                iVar37 = 0;
                              }
                              iVar53 = iVar36 + auVar40._4_4_;
                              if (0xfe < iVar53) {
                                iVar53 = 0xff;
                              }
                              if (iVar53 < 1) {
                                iVar53 = 0;
                              }
                              iVar36 = iVar36 + uVar33;
                              if (0xfe < iVar36) {
                                iVar36 = 0xff;
                              }
                              if (iVar36 < 1) {
                                iVar36 = 0;
                              }
                              iVar51 = auVar47._4_4_;
                              iVar54 = auVar47._8_4_;
                              iVar56 = auVar47._12_4_;
                              auVar47._0_4_ = iVar37 + (auVar47._0_4_ - auVar40._0_4_);
                              auVar47._4_4_ = iVar53 + (iVar51 - auVar40._4_4_);
                              auVar47._8_4_ = iVar54 - auVar40._8_4_;
                              auVar47._12_4_ = iVar56 - auVar40._12_4_;
                              iVar29 = (iVar29 - uVar33) + iVar36;
                              lVar31 = lVar31 + 1;
                            } while (uVar6 != (uint)lVar31);
                          }
                          iVar36 = auVar47._0_4_;
                          iVar53 = auVar47._4_4_;
                          auVar41._0_4_ = -(uint)(iVar36 == 0);
                          auVar41._4_4_ = -(uint)(iVar36 == 0);
                          auVar41._8_4_ = -(uint)(iVar53 == 0);
                          auVar41._12_4_ = -(uint)(iVar53 == 0);
                          uVar33 = movmskpd(uVar33,auVar41);
                          lVar31 = local_60;
                          local_74 = iVar38;
                          if (((((uVar33 ^ 3) & 1) == 0) && ((byte)((byte)(uVar33 ^ 3) >> 1) == 0))
                             && (iVar37 = 0, iVar29 == 0)) break;
                          auVar63._0_4_ = (float)iVar36;
                          auVar63._4_4_ = (float)iVar53;
                          auVar63._8_4_ = (float)auVar47._8_4_;
                          auVar63._12_4_ = (float)auVar47._12_4_;
                          uVar33 = this->m_limit;
                          fVar45 = (float)(int)uVar33;
                          auVar18._4_4_ = fStack_54;
                          auVar18._0_4_ = local_58;
                          auVar18._8_4_ = fStack_50;
                          auVar18._12_4_ = fStack_4c;
                          auVar59 = divps(auVar63,auVar18);
                          uVar2 = *(undefined8 *)(this->m_avg_color).m_s;
                          auVar48._0_4_ = fVar45 * ((float)uVar2 - auVar59._0_4_);
                          auVar48._4_4_ = fVar45 * ((float)((ulong)uVar2 >> 0x20) - auVar59._4_4_);
                          auVar48._8_4_ = fVar45 * (0.0 - auVar59._8_4_);
                          auVar48._12_4_ = fVar45 * (0.0 - auVar59._12_4_);
                          auVar59 = divps(auVar48,_DAT_001ba770);
                          fVar46 = auVar59._0_4_ + 0.5;
                          fVar52 = auVar59._4_4_ + 0.5;
                          fVar55 = auVar59._8_4_ + 0.0;
                          fVar57 = auVar59._12_4_ + 0.0;
                          auVar50._0_4_ = (int)fVar46;
                          auVar50._4_4_ = (int)fVar52;
                          auVar50._8_4_ = (int)fVar55;
                          auVar50._12_4_ = (int)fVar57;
                          auVar60._0_4_ = auVar50._0_4_ >> 0x1f;
                          auVar60._4_4_ = auVar50._4_4_ >> 0x1f;
                          auVar60._8_4_ = auVar50._8_4_ >> 0x1f;
                          auVar60._12_4_ = auVar50._12_4_ >> 0x1f;
                          auVar49._0_4_ = (int)(fVar46 - 2.1474836e+09);
                          auVar49._4_4_ = (int)(fVar52 - 2.1474836e+09);
                          auVar49._8_4_ = (int)(fVar55 - 2.1474836e+09);
                          auVar49._12_4_ = (int)(fVar57 - 2.1474836e+09);
                          auVar50 = auVar49 & auVar60 | auVar50;
                          auVar61._4_4_ = uVar33;
                          auVar61._0_4_ = uVar33;
                          auVar61._8_8_ = 0;
                          auVar64._0_4_ = -(uint)(auVar50._0_4_ < (int)uVar33);
                          auVar64._4_4_ = -(uint)(auVar50._4_4_ < (int)uVar33);
                          auVar64._8_4_ = -(uint)(auVar50._8_4_ < 0);
                          auVar64._12_4_ = -(uint)(auVar50._12_4_ < 0);
                          auVar42._0_4_ = -(uint)(auVar50._0_4_ < 0);
                          auVar42._4_4_ = -(uint)(auVar50._4_4_ < 0);
                          auVar42._8_4_ = -(uint)(auVar50._8_4_ < 0);
                          auVar42._12_4_ = -(uint)(auVar50._12_4_ < 0);
                          auVar59 = ~auVar42 & (~auVar64 & auVar61 | auVar50 & auVar64);
                          uVar28 = auVar59._0_4_;
                          iVar36 = auVar59._4_4_;
                          uVar35 = (uint)(long)((((this->m_avg_color).m_s[2] -
                                                 (float)iVar29 / local_48) * fVar45) / 255.0 + 0.5);
                          if ((int)uVar35 < (int)uVar33) {
                            uVar33 = uVar35;
                          }
                          iVar29 = 0;
                          if ((int)uVar35 < 0) {
                            uVar33 = 0;
                          }
                          iVar37 = 0;
                          if (((local_78 == uVar28) && (iVar34 == iVar36)) && (local_80 == uVar33))
                          break;
                          uVar3._0_4_ = (this->m_best_solution).m_coords.m_unscaled_color;
                          uVar3._4_4_ = (this->m_best_solution).m_coords.m_inten_table;
                          auVar10._8_6_ = 0;
                          auVar10._0_8_ = uVar3;
                          auVar10[0xe] = (char)((uint)uVar3._4_4_ >> 0x18);
                          auVar12._8_4_ = 0;
                          auVar12._0_8_ = uVar3;
                          auVar12[0xc] = (char)((uint)uVar3._4_4_ >> 0x10);
                          auVar12._13_2_ = auVar10._13_2_;
                          auVar13._8_4_ = 0;
                          auVar13._0_8_ = uVar3;
                          auVar13._12_3_ = auVar12._12_3_;
                          auVar14._8_2_ = 0;
                          auVar14._0_8_ = uVar3;
                          auVar14[10] = (char)((uint)uVar3._4_4_ >> 8);
                          auVar14._11_4_ = auVar13._11_4_;
                          auVar15._8_2_ = 0;
                          auVar15._0_8_ = uVar3;
                          auVar15._10_5_ = auVar14._10_5_;
                          auVar16[8] = (char)uVar3._4_4_;
                          auVar16._0_8_ = uVar3;
                          auVar16._9_6_ = auVar15._9_6_;
                          auVar19._7_8_ = 0;
                          auVar19._0_7_ = auVar16._8_7_;
                          Var20 = CONCAT81(SUB158(auVar19 << 0x40,7),
                                           (char)((uint)(undefined4)uVar3 >> 0x18));
                          auVar24._9_6_ = 0;
                          auVar24._0_9_ = Var20;
                          auVar21._1_10_ = SUB1510(auVar24 << 0x30,5);
                          auVar21[0] = (char)((uint)(undefined4)uVar3 >> 0x10);
                          auVar25._11_4_ = 0;
                          auVar25._0_11_ = auVar21;
                          auVar22._1_12_ = SUB1512(auVar25 << 0x20,3);
                          auVar22[0] = (char)((uint)(undefined4)uVar3 >> 8);
                          uVar44 = CONCAT11(0,(byte)(undefined4)uVar3);
                          auVar17._2_13_ = auVar22;
                          auVar17._0_2_ = uVar44;
                          auVar11._10_2_ = 0;
                          auVar11._0_10_ = auVar17._0_10_;
                          auVar11._12_2_ = (short)Var20;
                          auVar23._2_4_ = auVar11._10_4_;
                          auVar23._0_2_ = auVar21._0_2_;
                          auVar23._6_8_ = 0;
                          iVar53 = (int)CONCAT82(SUB148(auVar23 << 0x40,6),auVar22._0_2_);
                          auVar62._0_4_ = -(uint)(uVar28 == uVar44);
                          auVar62._4_4_ = -(uint)(uVar28 == uVar44);
                          auVar62._8_4_ = -(uint)(iVar36 == iVar53);
                          auVar62._12_4_ = -(uint)(iVar36 == iVar53);
                          uVar35 = movmskpd(uVar35,auVar62);
                          if ((((uVar35 & 1) != 0) &&
                              (bVar32 = (byte)uVar35 >> 1,
                              uVar35 = CONCAT31((int3)(uVar35 >> 8),bVar32), bVar32 != 0)) &&
                             (bVar32 = (this->m_best_solution).m_coords.m_unscaled_color.field_0.
                                       field_0.b, uVar35 = (uint)bVar32, uVar33 == bVar32)) break;
                          uVar1 = this->m_br;
                          uVar4 = this->m_bg;
                          auVar43._4_4_ = -(uint)(uVar1 == uVar28);
                          auVar43._0_4_ = -(uint)(uVar1 == uVar28);
                          auVar43._8_4_ = -(uint)(uVar4 == iVar36);
                          auVar43._12_4_ = -(uint)(uVar4 == iVar36);
                          uVar35 = movmskpd(uVar35,auVar43);
                          iVar37 = iVar29;
                          if ((((uVar35 & 1) != 0) && ((byte)((byte)uVar35 >> 1) != 0)) &&
                             (this->m_bb == uVar33)) break;
                          if (0xfe < (int)uVar28) {
                            uVar28 = 0xff;
                          }
                          local_b0 = this->m_pParams->m_use_color4;
                          local_b8.field_0.r = (uchar)uVar28;
                          if ((int)uVar28 < 1) {
                            local_b8.field_0.r = '\0';
                          }
                          if (0xfe < iVar36) {
                            iVar36 = 0xff;
                          }
                          local_b8.field_0.g = (uchar)iVar36;
                          if (iVar36 < 1) {
                            local_b8.field_0.g = '\0';
                          }
                          if (0xfe < (int)uVar33) {
                            uVar33 = 0xff;
                          }
                          local_b8.field_0.b = (uchar)uVar33;
                          if ((int)uVar33 < 1) {
                            local_b8.field_0.b = '\0';
                          }
                          local_b8.field_0.a = 0xff;
                          local_b4 = 0;
                          if ((this->m_pParams->super_crn_etc1_pack_params).m_quality ==
                              cCRNETCQualitySlow) {
                            bVar27 = evaluate_solution(this,(etc1_solution_coordinates *)
                                                            &local_b8.field_0,local_98,local_a0);
                          }
                          else {
                            bVar27 = evaluate_solution_fast
                                               (this,(etc1_solution_coordinates *)&local_b8.field_0,
                                                local_98,local_a0);
                          }
                          lVar31 = local_60;
                          if ((bVar27 == false) || (iVar38 = iVar38 + 1, iVar38 == local_7c)) break;
                        }
                      }
                    }
                  }
                } while (((iVar37 == 10) || (iVar38 = 0, iVar37 == 0)) &&
                        (lVar30 = lVar30 + 1, iVar38 = 0, lVar30 != lVar31));
              }
            }
            bVar27 = false;
          } while (((iVar38 == 7) || (iVar38 == 0)) && (lVar30 = local_68 + 1, lVar30 != lVar31));
        }
      }
    } while ((!bVar27) && (lVar30 = local_70 + 1, lVar30 != lVar31));
  }
  bVar27 = (this->m_best_solution).m_valid;
  if (bVar27 == false) {
    this->m_pResult->m_error = 0xffffffff;
  }
  else {
    __src = (this->m_best_solution).m_selectors.m_p;
    this->m_pResult->m_error = (this->m_best_solution).m_error;
    prVar9 = this->m_pResult;
    (prVar9->m_block_color_unscaled).field_0.field_0.r =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.r;
    (prVar9->m_block_color_unscaled).field_0.field_0.g =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.g;
    (prVar9->m_block_color_unscaled).field_0.field_0.b =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.b;
    (prVar9->m_block_color_unscaled).field_0.field_0.a =
         (this->m_best_solution).m_coords.m_unscaled_color.field_0.field_0.a;
    this->m_pResult->m_block_color4 = (this->m_best_solution).m_coords.m_color4;
    this->m_pResult->m_block_inten_table = (this->m_best_solution).m_coords.m_inten_table;
    memcpy(this->m_pResult->m_pSelectors,__src,(ulong)uVar6);
    this->m_pResult->m_n = uVar6;
  }
  return bVar27;
}

Assistant:

bool etc1_optimizer::compute() {
  const uint n = m_pParams->m_num_src_pixels;
  const int scan_delta_size = m_pParams->m_scan_delta_size;

  // Scan through a subset of the 3D lattice centered around the avg block color trying each 3D (555 or 444) lattice point as a potential block color.
  // Each time a better solution is found try to refine the current solution's block color based of the current selectors and intensity table index.
  for (int zdi = 0; zdi < scan_delta_size; zdi++) {
    const int zd = m_pParams->m_pScan_deltas[zdi];
    const int mbb = m_bb + zd;
    if (mbb < 0)
      continue;
    else if (mbb > m_limit)
      break;

    for (int ydi = 0; ydi < scan_delta_size; ydi++) {
      const int yd = m_pParams->m_pScan_deltas[ydi];
      const int mbg = m_bg + yd;
      if (mbg < 0)
        continue;
      else if (mbg > m_limit)
        break;

      for (int xdi = 0; xdi < scan_delta_size; xdi++) {
        const int xd = m_pParams->m_pScan_deltas[xdi];
        const int mbr = m_br + xd;
        if (mbr < 0)
          continue;
        else if (mbr > m_limit)
          break;

        etc1_solution_coordinates coords(mbr, mbg, mbb, 0, m_pParams->m_use_color4);
        if (m_pParams->m_quality == cCRNETCQualitySlow) {
          if (!evaluate_solution(coords, m_trial_solution, &m_best_solution))
            continue;
        } else {
          if (!evaluate_solution_fast(coords, m_trial_solution, &m_best_solution))
            continue;
        }

        // Now we have the input block, the avg. color of the input pixels, a set of trial selector indices, and the block color+intensity index.
        // Now, for each component, attempt to refine the current solution by solving a simple linear equation. For example, for 4 colors:
        // The goal is:
        // pixel0 - (block_color+inten_table[selector0]) + pixel1 - (block_color+inten_table[selector1]) + pixel2 - (block_color+inten_table[selector2]) + pixel3 - (block_color+inten_table[selector3]) = 0
        // Rearranging this:
        // (pixel0 + pixel1 + pixel2 + pixel3) - (block_color+inten_table[selector0]) - (block_color+inten_table[selector1]) - (block_color+inten_table[selector2]) - (block_color+inten_table[selector3]) = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - block_color - inten_table[selector0] - block_color-inten_table[selector1] - block_color-inten_table[selector2] - block_color-inten_table[selector3] = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - inten_table[selector0] - inten_table[selector1] - inten_table[selector2] - inten_table[selector3] = 0
        // (pixel0 + pixel1 + pixel2 + pixel3) - 4*block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3]) = 0
        // (pixel0 + pixel1 + pixel2 + pixel3)/4 - block_color - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4 = 0
        // block_color = (pixel0 + pixel1 + pixel2 + pixel3)/4 - (inten_table[selector0] + inten_table[selector1] + inten_table[selector2] + inten_table[selector3])/4
        // So what this means:
        // optimal_block_color = avg_input - avg_inten_delta
        // So the optimal block color can be computed by taking the average block color and subtracting the current average of the intensity delta.
        // Unfortunately, optimal_block_color must then be quantized to 555 or 444 so it's not always possible to improve matters using this formula.
        // Also, the above formula is for unclamped intensity deltas. The actual implementation takes into account clamping.

        const uint max_refinement_trials = (m_pParams->m_quality == cCRNETCQualityFast) ? 2 : (((xd | yd | zd) == 0) ? 4 : 2);
        for (uint refinement_trial = 0; refinement_trial < max_refinement_trials; refinement_trial++) {
          const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();
          const int* pInten_table = g_etc1_inten_tables[m_best_solution.m_coords.m_inten_table];

          int delta_sum_r = 0, delta_sum_g = 0, delta_sum_b = 0;
          const color_quad_u8 base_color(m_best_solution.m_coords.get_scaled_color());
          for (uint r = 0; r < n; r++) {
            const uint s = *pSelectors++;
            const int yd = pInten_table[s];
            // Compute actual delta being applied to each pixel, taking into account clamping.
            delta_sum_r += math::clamp<int>(base_color.r + yd, 0, 255) - base_color.r;
            delta_sum_g += math::clamp<int>(base_color.g + yd, 0, 255) - base_color.g;
            delta_sum_b += math::clamp<int>(base_color.b + yd, 0, 255) - base_color.b;
          }
          if ((!delta_sum_r) && (!delta_sum_g) && (!delta_sum_b))
            break;
          const float avg_delta_r_f = static_cast<float>(delta_sum_r) / n;
          const float avg_delta_g_f = static_cast<float>(delta_sum_g) / n;
          const float avg_delta_b_f = static_cast<float>(delta_sum_b) / n;
          const int br1 = math::clamp<int>(static_cast<uint>((m_avg_color[0] - avg_delta_r_f) * m_limit / 255.0f + .5f), 0, m_limit);
          const int bg1 = math::clamp<int>(static_cast<uint>((m_avg_color[1] - avg_delta_g_f) * m_limit / 255.0f + .5f), 0, m_limit);
          const int bb1 = math::clamp<int>(static_cast<uint>((m_avg_color[2] - avg_delta_b_f) * m_limit / 255.0f + .5f), 0, m_limit);

          bool skip = false;

          if ((mbr == br1) && (mbg == bg1) && (mbb == bb1))
            skip = true;
          else if ((br1 == m_best_solution.m_coords.m_unscaled_color.r) && (bg1 == m_best_solution.m_coords.m_unscaled_color.g) && (bb1 == m_best_solution.m_coords.m_unscaled_color.b))
            skip = true;
          else if ((m_br == br1) && (m_bg == bg1) && (m_bb == bb1))
            skip = true;

          if (skip)
            break;

          etc1_solution_coordinates coords1(br1, bg1, bb1, 0, m_pParams->m_use_color4);
          if (m_pParams->m_quality == cCRNETCQualitySlow) {
            if (!evaluate_solution(coords1, m_trial_solution, &m_best_solution))
              break;
          } else {
            if (!evaluate_solution_fast(coords1, m_trial_solution, &m_best_solution))
              break;
          }

        }  // refinement_trial

      }  // xdi
    }    // ydi
  }      // zdi

  if (!m_best_solution.m_valid) {
    m_pResult->m_error = cUINT32_MAX;
    return false;
  }

  const uint8* pSelectors = m_best_solution.m_selectors.get_ptr();

#ifdef CRNLIB_BUILD_DEBUG
  {
    color_quad_u8 block_colors[4];
    m_best_solution.m_coords.get_block_colors(block_colors);

    const color_quad_u8* pSrc_pixels = m_pParams->m_pSrc_pixels;
    uint64 actual_error = 0;
    for (uint i = 0; i < n; i++)
      actual_error += color::elucidian_distance(pSrc_pixels[i], block_colors[pSelectors[i]], false);

    CRNLIB_ASSERT(actual_error == m_best_solution.m_error);
  }
#endif

  m_pResult->m_error = m_best_solution.m_error;

  m_pResult->m_block_color_unscaled = m_best_solution.m_coords.m_unscaled_color;
  m_pResult->m_block_color4 = m_best_solution.m_coords.m_color4;

  m_pResult->m_block_inten_table = m_best_solution.m_coords.m_inten_table;
  memcpy(m_pResult->m_pSelectors, pSelectors, n);
  m_pResult->m_n = n;

  return true;
}